

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FreeTypeFaceWrapper.cpp
# Opt level: O0

EFontStretch __thiscall FreeTypeFaceWrapper::GetFontStretch(FreeTypeFaceWrapper *this)

{
  EFontStretch result;
  FreeTypeFaceWrapper *this_local;
  
  if (this->mFormatParticularWrapper == (IFreeTypeFaceExtender *)0x0) {
    this_local._4_4_ = StretchFromName(this);
  }
  else {
    this_local._4_4_ = (*this->mFormatParticularWrapper->_vptr_IFreeTypeFaceExtender[6])();
    if (this_local._4_4_ == eFontStretchUknown) {
      this_local._4_4_ = StretchFromName(this);
    }
  }
  return this_local._4_4_;
}

Assistant:

EFontStretch FreeTypeFaceWrapper::GetFontStretch()
{
	if(mFormatParticularWrapper)
	{
		EFontStretch result = mFormatParticularWrapper->GetFontStretch();
		if(eFontStretchUknown == result)
			return StretchFromName();
		else
			return result;
	}
	return StretchFromName();
}